

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O0

void __thiscall
kj::_::Debug::Fault::
Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::schema::Node::Which,capnp::schema::Node::Which&>&,char_const(&)[46],unsigned_long&,unsigned_int,unsigned_int,capnp::Text::Reader>
          (Fault *this,char *file,int line,Type code,char *condition,char *macroArgs,
          DebugComparison<capnp::schema::Node::Which,_capnp::schema::Node::Which_&> *params,
          char (*params_1) [46],unsigned_long *params_2,uint *params_3,uint *params_4,
          Reader *params_5)

{
  undefined4 in_register_00000014;
  char (*params_00) [46];
  unsigned_long *params_01;
  uint *params_02;
  uint *params_03;
  Reader *params_04;
  ArrayDisposer **local_130;
  undefined1 local_c8 [8];
  String argValues [6];
  char *macroArgs_local;
  char *condition_local;
  Type code_local;
  int line_local;
  char *file_local;
  Fault *this_local;
  
  this->exception = (Exception *)0x0;
  str<kj::_::DebugComparison<capnp::schema::Node::Which,capnp::schema::Node::Which&>&>
            ((String *)local_c8,(kj *)params,
             (DebugComparison<capnp::schema::Node::Which,_capnp::schema::Node::Which_&> *)
             CONCAT44(in_register_00000014,line));
  str<char_const(&)[46]>((String *)&argValues[0].content.disposer,(kj *)params_1,params_00);
  str<unsigned_long&>((String *)&argValues[1].content.disposer,(kj *)params_2,params_01);
  str<unsigned_int&>((String *)&argValues[2].content.disposer,(kj *)params_3,params_02);
  str<unsigned_int&>((String *)&argValues[3].content.disposer,(kj *)params_4,params_03);
  str<capnp::Text::Reader&>((String *)&argValues[4].content.disposer,(kj *)params_5,params_04);
  arrayPtr<kj::String>((String *)local_c8,6);
  init(this,(EVP_PKEY_CTX *)file);
  local_130 = &argValues[5].content.disposer;
  do {
    local_130 = local_130 + -3;
    String::~String((String *)local_130);
  } while (local_130 != (ArrayDisposer **)local_c8);
  return;
}

Assistant:

Debug::Fault::Fault(const char* file, int line, Code code,
                    const char* condition, const char* macroArgs, Params&&... params)
    : exception(nullptr) {
  String argValues[sizeof...(Params)] = {str(params)...};
  init(file, line, code, condition, macroArgs,
       arrayPtr(argValues, sizeof...(Params)));
}